

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

longdouble * anon_unknown.dwarf_66e92::roundtrip<long_double>(longdouble *in)

{
  longdouble *extraout_RAX;
  longdouble out;
  longdouble *in_stack_00000218;
  longdouble *in_stack_00000220;
  
  (anonymous_namespace)::roundtrip_into<long_double,long_double>
            (in_stack_00000220,in_stack_00000218);
  return extraout_RAX;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}